

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  SerialArena *this;
  __int_type_conflict2 _Var1;
  bool bVar2;
  uint32_t size;
  uint uVar3;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar4;
  void *x;
  RepeatedPtrFieldBase *this_00;
  ushort *p;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  LogMessage *this_01;
  string *s;
  ulong uVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar7;
  uint *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 s_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *ctx_00;
  uint32_t *out;
  size_t offset;
  uint64_t uVar9;
  ushort uVar10;
  ushort v;
  long in_FS_OFFSET;
  string_view wire_bytes;
  string_view wire_bytes_00;
  uint32_t next_tag;
  uint64_t local_58;
  LogMessage local_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_38;
  
  uVar9 = hasbits;
  aVar4 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
          RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  s_00._0_4_ = data.field_0._0_4_ & 7;
  s_00.data._4_4_ = 0;
  if (s_00._0_4_ != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_001d867f;
  }
  uVar10 = *(uint16_t *)(aVar4.data + 10);
  v = uVar10 & 0x1c0;
  local_58 = hasbits;
  local_38 = data.field_0;
  x = MaybeGetSplitBase(msg,true,table);
  if (v != 0x100) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x9b7);
    this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (&local_50,(char (*) [34])"Unsupported repeated string rep: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<(this_01,v);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  uVar10 = uVar10 & 0x600;
  out = (uint32_t *)(ulong)*(uint *)aVar4;
  local_40 = aVar4;
  this_00 = &MaybeCreateRepeatedRefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>,true>
                       (x,(size_t)out,msg)->super_RepeatedPtrFieldBase;
  if ((this_00->arena_ == (Arena *)0x0) ||
     (s_00.data = 0xffffffffffffff80,
     *(uint64_t *)(in_FS_OFFSET + -0x78) != (this_00->arena_->impl_).tag_and_id_)) {
LAB_001d85dc:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString(this_00);
      p = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
      ctx_00 = extraout_RDX_02;
      if (p == (ushort *)0x0) goto LAB_001d86c2;
      ptr = (s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)ptr;
      s_00 = local_40;
      bVar2 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)local_40,(FieldEntry *)(ulong)uVar10,(uint16_t)uVar9)
      ;
      ctx_00 = extraout_RDX_03;
      if (!bVar2) goto LAB_001d86c2;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_001d868f;
      ptr = ReadTag((char *)p,&next_tag,0);
    } while (next_tag == (uint32_t)local_38.data);
  }
  else {
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    bVar2 = RepeatedPtrFieldBase::PrepareForParse(this_00);
    if (!bVar2) goto LAB_001d85dc;
    do {
      local_50._0_8_ = ptr;
      size = ReadSize((char **)&local_50);
      ctx_00 = extraout_RDX;
      ptr = (char *)out;
      if ((uint32_t *)local_50._0_8_ == (uint32_t *)0x0) {
LAB_001d86c2:
        pcVar7 = Error(msg,ptr,ctx_00,(TcFieldData)s_00,table,local_58);
        return pcVar7;
      }
      _Var1 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var1 == 0) {
        s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        offset = _Var1 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = offset;
        s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               StringBlock::AtOffset_abi_cxx11_((this->string_block_)._M_b._M_p,offset);
      }
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)s_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(s_00.data + 0x10);
      *(size_type *)(s_00.data + 8) = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(s_00.data + 0x10))->_M_local_buf[0] = '\0';
      RepeatedPtrFieldBase::AddAllocatedForParse(this_00,(void *)s_00);
      ptr = (char *)local_50._0_8_;
      p = (ushort *)
          EpsCopyInputStream::ReadString
                    (&ctx->super_EpsCopyInputStream,(char *)local_50._0_8_,size,(string *)s_00);
      ctx_00 = extraout_RDX_00;
      if (p == (ushort *)0x0) goto LAB_001d86c2;
      pVVar5 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (this_00,this_00->current_size_ + -1);
      ptr = (pVVar5->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)ptr;
      s_00 = local_40;
      bVar2 = MpVerifyUtf8((TcParser *)pVVar5->_M_string_length,wire_bytes,
                           (TcParseTableBase *)local_40,(FieldEntry *)(ulong)uVar10,(uint16_t)uVar9)
      ;
      ctx_00 = extraout_RDX_01;
      if (!bVar2) goto LAB_001d86c2;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_001d868f;
      out = &next_tag;
      ptr = ReadTag((char *)p,out,0);
    } while (next_tag == (uint32_t)local_38.data);
  }
  ptr = (char *)p;
  p = (ushort *)ptr;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_001d868f:
    if (table->has_bits_offset != 0) {
      puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar8 = *puVar8 | (uint)local_58;
    }
    return (char *)p;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar3 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar6 = (ulong)(uVar3 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar6);
  hasbits = local_58;
LAB_001d867f:
  pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (ABSL_PREDICT_TRUE(arena != nullptr &&
                            arena->impl_.GetSerialArenaFast(&serial_arena) &&
                            field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (ABSL_PREDICT_FALSE(ptr == nullptr ||
                                 !MpVerifyUtf8(field[field.size() - 1], table,
                                               entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (ABSL_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}